

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint8_t *puVar1;
  ulong uVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  GGMTree *this;
  vector<GGMNode,_std::allocator<GGMNode>_> *__range1;
  undefined8 *puVar6;
  uint8_t *current_key;
  uint8_t *puVar7;
  vector<GGMNode,_std::allocator<GGMNode>_> remain_node;
  vector<GGMNode,_std::allocator<GGMNode>_> node_list;
  vector<long,_std::allocator<long>_> pos;
  vector<long,_std::allocator<long>_> remain_pos;
  vector<long,_std::allocator<long>_> delete_pos;
  GGMNode local_e8;
  vector<GGMNode,_std::allocator<GGMNode>_> local_c8;
  void *local_a8;
  iterator iStack_a0;
  long *local_98;
  undefined8 *local_88;
  undefined8 *puStack_80;
  long local_78;
  vector<long,_std::allocator<long>_> local_68;
  vector<GGMNode,_std::allocator<GGMNode>_> local_48;
  
  this = (GGMTree *)operator_new(4);
  GGMTree::GGMTree(this,8);
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (long *)0x0;
  local_98 = (long *)0x0;
  local_e8.index = (ulong)local_e8.index._4_4_ << 0x20;
  iVar5 = 0;
  do {
    if (iStack_a0._M_current == local_98) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<int&>
                ((vector<long,std::allocator<long>> *)&local_a8,iStack_a0,(int *)&local_e8);
      iVar4 = (int)local_e8.index;
    }
    else {
      *iStack_a0._M_current = (long)iVar5;
      iStack_a0._M_current = iStack_a0._M_current + 1;
      iVar4 = iVar5;
    }
    iVar5 = iVar4 + 1;
    local_e8.index = CONCAT44(local_e8.index._4_4_,iVar5);
  } while (iVar4 < 7);
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.index = CONCAT44(local_e8.index._4_4_,1);
  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<int>
            (&local_68,(iterator)0x0,(int *)&local_e8);
  local_88 = (undefined8 *)0x0;
  puStack_80 = (undefined8 *)0x0;
  local_78 = 0;
  std::
  __set_difference<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::insert_iterator<std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_a8,iStack_a0._M_current,
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_88,0);
  local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (GGMNode *)0x0;
  local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (GGMNode *)0x0;
  std::vector<GGMNode,_std::allocator<GGMNode>_>::reserve
            (&local_c8,(long)puStack_80 - (long)local_88 >> 3);
  puVar3 = puStack_80;
  for (puVar6 = local_88; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    puVar1 = (uint8_t *)*puVar6;
    local_e8.level = GGMTree::get_level(this);
    local_e8.key[0] = '\0';
    local_e8.key[1] = '\0';
    local_e8.key[2] = '\0';
    local_e8.key[3] = '\0';
    local_e8.key[4] = '\0';
    local_e8.key[5] = '\0';
    local_e8.key[6] = '\0';
    local_e8.key[7] = '\0';
    local_e8.key[8] = '\0';
    local_e8.key[9] = '\0';
    local_e8.key[10] = '\0';
    local_e8.key[0xb] = '\0';
    local_e8.key[0xc] = '\0';
    local_e8.key[0xd] = '\0';
    local_e8.key[0xe] = '\0';
    local_e8.key[0xf] = '\0';
    local_e8.index = (long)puVar1;
    if (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<GGMNode,_std::allocator<GGMNode>_>::_M_realloc_insert<GGMNode>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_e8);
    }
    else {
      uVar2 = (ulong)(uint)local_e8.level;
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[4] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[5] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[6] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[7] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[8] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[9] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[10] = '\0';
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[0xb] = '\0';
      *(ulong *)((local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                  super__Vector_impl_data._M_finish)->key + 0xc) =
           (ulong)(uint)local_e8._28_4_ << 0x20;
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->index = (long)puVar1;
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->level = (int)uVar2;
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[0] = (char)(uVar2 >> 0x20);
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[1] = (char)(uVar2 >> 0x28);
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[2] = (char)(uVar2 >> 0x30);
      (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish)->key[3] = (char)(uVar2 >> 0x38);
      local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
    }
  }
  std::vector<GGMNode,_std::allocator<GGMNode>_>::vector(&local_48,&local_c8);
  GGMTree::min_coverage((vector<GGMNode,_std::allocator<GGMNode>_> *)&local_e8,this,&local_48);
  if (local_48.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puVar1 = (uint8_t *)CONCAT44(local_e8.key._0_4_,local_e8.level);
  if ((uint8_t *)local_e8.index != puVar1) {
    current_key = (uint8_t *)(local_e8.index + 0xc);
    do {
      builtin_memcpy(current_key,"0123456789123456",0x10);
      GGMTree::derive_key_from_tree
                (current_key,*(long *)(current_key + -0xc),*(int *)(current_key + -4),0);
      puVar7 = current_key + 0x14;
      current_key = current_key + 0x20;
    } while (puVar7 != puVar1);
  }
  std::
  _Hashtable<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&keys._M_h);
  iVar5 = GGMTree::get_level(this);
  PPRF_compute_all_keys((vector<GGMNode,_std::allocator<GGMNode>_> *)&local_e8,iVar5);
  PPRF_Eval(0x102609);
  PPRF_Eval(0x102613);
  PPRF_Eval(0x10261a);
  if ((uint8_t *)local_e8.index != (uint8_t *)0x0) {
    operator_delete((void *)local_e8.index,
                    CONCAT44(local_e8.key._8_4_,local_e8.key._4_4_) - local_e8.index);
  }
  if (local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88 != (undefined8 *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  return 0;
}

Assistant:

int main() {
    /*Setup  */
    uint8_t *key = (unsigned char*) "0123456789123456";
    GGMTree *tree;
    tree = new GGMTree(GGM_SIZE);

    /*Punc */
    vector<long> pos;
    for (int i = 0; i < GGM_SIZE; ++i) {
        pos.emplace_back(i);
    }
    vector<long> delete_pos ;
    delete_pos.emplace_back(1);

    vector<long> remain_pos;
    set_difference(pos.begin(), pos.end(),
                   delete_pos.begin(), delete_pos.end(),
                   inserter(remain_pos, remain_pos.begin()));

    vector<GGMNode> node_list;
    node_list.reserve(remain_pos.size()); //preallocate memory for vector
    for (long pos : remain_pos) {
        node_list.emplace_back(GGMNode(pos, tree->get_level()));
    }
    vector<GGMNode> remain_node = tree->min_coverage(node_list);

    for(auto & i : remain_node) {
        memcpy(i.key, key, AES_BLOCK_SIZE);
        GGMTree::derive_key_from_tree(i.key, i.index, i.level, 0);
    }
    /*Eval */
    keys.clear();

    PPRF_compute_all_keys(remain_node, tree->get_level());// precompute all keys of nodes

    PPRF_Eval(1);
    PPRF_Eval(2);
    PPRF_Eval(0);

    return 0;
}